

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_io.cc
# Opt level: O0

void __thiscall
gimage::RAWImageIO::load
          (RAWImageIO *this,ImageU8 *image,char *name,int ds,long x,long y,long w,long h)

{
  byte bVar1;
  bool bVar2;
  store_t v_00;
  _Ios_Iostate __a;
  _Ios_Openmode _Var3;
  uint uVar4;
  undefined8 uVar5;
  int *piVar6;
  long *plVar7;
  size_t *psVar8;
  char *in_RDX;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *in_RSI;
  long *in_RDI;
  long in_R8;
  long in_R9;
  long in_stack_00000008;
  long in_stack_00000010;
  failure *ex;
  long i_2;
  long k_1;
  streambuf *sb_1;
  long i_1;
  long j;
  store_t v;
  int ii;
  long i;
  long j_1;
  streambuf *sb;
  long kk;
  long k;
  valarray<int> nline;
  valarray<int> vline;
  ifstream in;
  bool msbfirst;
  int type;
  long height;
  long width;
  string filename;
  undefined7 in_stack_fffffffffffffa18;
  store_t in_stack_fffffffffffffa1f;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *in_stack_fffffffffffffa20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa28;
  valarray<int> *in_stack_fffffffffffffa30;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *in_stack_fffffffffffffa40;
  long lVar9;
  string *in_stack_fffffffffffffa58;
  undefined4 in_stack_fffffffffffffa60;
  undefined4 in_stack_fffffffffffffa64;
  int iVar10;
  long in_stack_fffffffffffffa68;
  long in_stack_fffffffffffffa70;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *pIVar11;
  long in_stack_fffffffffffffa78;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *in_stack_fffffffffffffa80;
  long k_00;
  long local_468;
  long local_460;
  long local_450 [3];
  long local_438 [3];
  byte local_41d;
  int local_41c;
  long local_418 [3];
  long local_400 [3];
  undefined8 local_3e8;
  long local_3e0;
  undefined8 local_3d8;
  undefined8 local_3d0;
  long local_3c8;
  undefined4 local_3c0;
  undefined4 local_3bc;
  long local_3b8 [3];
  undefined4 local_39c;
  valarray<int> local_398;
  undefined4 local_384;
  valarray<int> local_380;
  long local_370 [21];
  long *in_stack_fffffffffffffd38;
  long *in_stack_fffffffffffffd40;
  bool *in_stack_fffffffffffffd48;
  int *in_stack_fffffffffffffd50;
  char *in_stack_fffffffffffffd58;
  int local_168;
  undefined1 local_162;
  allocator local_161;
  string local_160 [96];
  string local_100 [38];
  undefined1 local_da;
  allocator local_d9;
  string local_d8 [116];
  int local_64;
  long local_60;
  long local_58;
  string local_50 [32];
  long local_30;
  long local_28;
  int local_1c;
  char *local_18;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *local_10;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::__cxx11::string::string(local_50);
  bVar1 = (**(code **)(*in_RDI + 0x18))(in_RDI,local_18,1);
  if ((bVar1 & 1) == 0) {
    local_da = 1;
    uVar5 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d8,local_18,&local_d9);
    std::operator+((char *)in_stack_fffffffffffffa28,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffa20);
    std::operator+(in_stack_fffffffffffffa28,(char *)in_stack_fffffffffffffa20);
    gutil::IOException::IOException
              ((IOException *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
               in_stack_fffffffffffffa58);
    local_da = 0;
    __cxa_throw(uVar5,&gutil::IOException::typeinfo,gutil::IOException::~IOException);
  }
  (anonymous_namespace)::readRAWHeader_abi_cxx11_
            (in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
             in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  std::__cxx11::string::operator=(local_50,local_100);
  std::__cxx11::string::~string(local_100);
  if (1 < local_64) {
    local_162 = 1;
    uVar5 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_160,local_18,&local_161);
    std::operator+((char *)in_stack_fffffffffffffa28,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffa20);
    std::operator+(in_stack_fffffffffffffa28,(char *)in_stack_fffffffffffffa20);
    gutil::IOException::IOException
              ((IOException *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
               in_stack_fffffffffffffa58);
    local_162 = 0;
    __cxa_throw(uVar5,&gutil::IOException::typeinfo,gutil::IOException::~IOException);
  }
  local_168 = 1;
  piVar6 = std::max<int>(&local_168,&local_1c);
  local_1c = *piVar6;
  if (in_stack_00000008 < 0) {
    in_stack_00000008 = (local_58 + local_1c + -1) / (long)local_1c;
  }
  if (in_stack_00000010 < 0) {
    in_stack_00000010 = (local_60 + local_1c + -1) / (long)local_1c;
  }
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::setSize
            (in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,in_stack_fffffffffffffa70,
             in_stack_fffffffffffffa68);
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::clear(in_stack_fffffffffffffa40);
  std::ifstream::ifstream(local_370);
  uVar5 = *(undefined8 *)(local_370[0] + -0x18);
  __a = std::operator|(_S_failbit,_S_badbit);
  std::operator|(__a,_S_eofbit);
  std::ios::exceptions((int)local_370 + (int)uVar5);
  _Var3 = std::__cxx11::string::c_str();
  std::ifstream::open((char *)local_370,_Var3);
  if ((((local_1c < 2) && (local_28 == 0)) && (local_30 == 0)) &&
     ((in_stack_00000008 == local_58 && (in_stack_00000010 == local_60)))) {
    std::ifstream::rdbuf();
    for (local_460 = 0; local_460 < local_60; local_460 = local_460 + 1) {
      for (local_468 = 0; pIVar11 = local_10, local_468 < local_58; local_468 = local_468 + 1) {
        lVar9 = local_468;
        v_00 = std::streambuf::sbumpc();
        Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::set
                  (pIVar11,lVar9,local_460,0,v_00);
      }
    }
  }
  else {
    local_384 = 0;
    std::valarray<int>::valarray
              (in_stack_fffffffffffffa30,(int *)in_stack_fffffffffffffa28,
               (size_t)in_stack_fffffffffffffa20);
    local_39c = 0;
    std::valarray<int>::valarray
              (in_stack_fffffffffffffa30,(int *)in_stack_fffffffffffffa28,
               (size_t)in_stack_fffffffffffffa20);
    local_3b8[1] = 0;
    local_3b8[0] = -local_30;
    plVar7 = std::max<long>(local_3b8 + 1,local_3b8);
    for (local_3b8[2] = *plVar7;
        local_3b8[2] < in_stack_00000010 && (local_30 + local_3b8[2]) * (long)local_1c < local_60;
        local_3b8[2] = local_3b8[2] + 1) {
      local_3bc = 0;
      std::valarray<int>::operator=
                ((valarray<int> *)in_stack_fffffffffffffa20,
                 (int *)CONCAT17(in_stack_fffffffffffffa1f,in_stack_fffffffffffffa18));
      local_3c0 = 0;
      std::valarray<int>::operator=
                ((valarray<int> *)in_stack_fffffffffffffa20,
                 (int *)CONCAT17(in_stack_fffffffffffffa1f,in_stack_fffffffffffffa18));
      local_3c8 = 0;
      while( true ) {
        bVar2 = false;
        if (local_3c8 < local_1c) {
          bVar2 = local_3c8 + (local_30 + local_3b8[2]) * (long)local_1c < local_60;
        }
        if (!bVar2) break;
        local_3e0 = 0;
        std::max<long>(&local_3e0,&local_28);
        std::fpos<__mbstate_t>::fpos
                  ((fpos<__mbstate_t> *)in_stack_fffffffffffffa20,
                   CONCAT17(in_stack_fffffffffffffa1f,in_stack_fffffffffffffa18));
        std::istream::seekg(local_370,local_3d8,local_3d0);
        local_3e8 = std::ifstream::rdbuf();
        local_400[1] = 0;
        local_400[0] = -local_28;
        psVar8 = (size_t *)std::max<long>(local_400 + 1,local_400);
        local_400[2] = *psVar8;
        local_418[1] = 0;
        local_418[0] = -local_28;
        plVar7 = std::max<long>(local_418 + 1,local_418);
        for (local_418[2] = *plVar7;
            local_418[2] < in_stack_00000008 &&
            (local_28 + local_418[2]) * (long)local_1c < local_58; local_418[2] = local_418[2] + 1)
        {
          local_41c = 0;
          while( true ) {
            bVar2 = false;
            if (local_41c < local_1c) {
              bVar2 = (local_28 + local_418[2]) * (long)local_1c + (long)local_41c < local_58;
            }
            if (!bVar2) break;
            local_41d = std::streambuf::sbumpc();
            bVar2 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::isValidS
                              (in_stack_fffffffffffffa20,in_stack_fffffffffffffa1f);
            if (bVar2) {
              uVar4 = (uint)local_41d;
              piVar6 = std::valarray<int>::operator[](&local_380,local_400[2]);
              *piVar6 = *piVar6 + uVar4;
              piVar6 = std::valarray<int>::operator[](&local_398,local_400[2]);
              *piVar6 = *piVar6 + 1;
            }
            local_41c = local_41c + 1;
          }
          local_400[2] = local_400[2] + 1;
        }
        local_3c8 = local_3c8 + 1;
      }
      local_438[1] = 0;
      local_438[0] = -local_28;
      psVar8 = (size_t *)std::max<long>(local_438 + 1,local_438);
      local_438[2] = *psVar8;
      local_450[1] = 0;
      local_450[0] = -local_28;
      plVar7 = std::max<long>(local_450 + 1,local_450);
      for (local_450[2] = *plVar7;
          local_450[2] < in_stack_00000008 && (local_28 + local_450[2]) * (long)local_1c < local_58;
          local_450[2] = local_450[2] + 1) {
        piVar6 = std::valarray<int>::operator[](&local_398,local_438[2]);
        if (0 < *piVar6) {
          pIVar11 = local_10;
          lVar9 = local_450[2];
          k_00 = local_3b8[2];
          piVar6 = std::valarray<int>::operator[](&local_380,local_438[2]);
          iVar10 = *piVar6;
          piVar6 = std::valarray<int>::operator[](&local_398,local_438[2]);
          Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::set
                    (pIVar11,lVar9,k_00,0,(store_t)(iVar10 / *piVar6));
        }
        local_438[2] = local_438[2] + 1;
      }
    }
    std::valarray<int>::~valarray((valarray<int> *)in_stack_fffffffffffffa20);
    std::valarray<int>::~valarray((valarray<int> *)in_stack_fffffffffffffa20);
  }
  std::ifstream::close();
  std::ifstream::~ifstream(local_370);
  std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

void RAWImageIO::load(ImageU8 &image, const char *name, int ds, long x, long y,
                      long w, long h) const
{
  std::string filename;
  long   width, height;
  int    type;
  bool   msbfirst;

  if (!handlesFile(name, true))
  {
    throw gutil::IOException("Can only load RAW image ("+std::string(name)+")");
  }

  filename=readRAWHeader(name, type, msbfirst, width, height);

  if (type > 1)
  {
    throw gutil::IOException("A 16 bit image cannot be loaded as 8 bit image ("+std::string(name)+")");
  }

  ds=std::max(1, ds);

  if (w < 0)
  {
    w=(width+ds-1)/ds;
  }

  if (h < 0)
  {
    h=(height+ds-1)/ds;
  }

  image.setSize(w, h, 1);
  image.clear();

  try
  {
    std::ifstream in;
    in.exceptions(std::ios_base::failbit | std::ios_base::badbit | std::ios_base::eofbit);
    in.open(filename.c_str(), std::ios::binary);

    // load downscaled part?

    if (ds > 1 || x != 0 || y != 0 || w != width || h != height)
    {
      std::valarray<ImageU8::work_t> vline(0, w);
      std::valarray<int> nline(0, w);

      for (long k=std::max(0l, -y); k<h && (y+k)*ds<height; k++)
      {
        // load downscaled line

        vline=0;
        nline=0;

        for (long kk=0; kk<ds && kk+(y+k)*ds<height; kk++)
        {
          in.seekg(static_cast<std::streamoff>((y+k)*ds+kk)*width+
                   static_cast<std::streamoff>(std::max(0l, x))*ds);

          std::streambuf *sb=in.rdbuf();

          long j=std::max(0l, -x);

          for (long i=std::max(0l, -x); i<w && (x+i)*ds<width; i++)
          {
            for (int ii=0; ii<ds && (x+i)*ds+ii<width; ii++)
            {
              ImageU8::store_t v=static_cast<ImageU8::store_t>(sb->sbumpc());

              if (image.isValidS(v))
              {
                vline[j]+=v;
                nline[j]++;
              }
            }

            j++;
          }
        }

        // store line into image

        long j=std::max(0l, -x);

        for (long i=std::max(0l, -x); i<w && (x+i)*ds<width; i++)
        {
          if (nline[j] > 0)
          {
            image.set(i, k, 0, static_cast<ImageU8::store_t>(vline[j]/nline[j]));
          }

          j++;
        }
      }
    }
    else // load whole image
    {
      std::streambuf *sb=in.rdbuf();

      for (long k=0; k<height; k++)
      {
        for (long i=0; i<width; i++)
        {
          image.set(i, k, 0, static_cast<ImageU8::store_t>(sb->sbumpc()));
        }
      }
    }

    in.close();
  }
  catch (const std::ios_base::failure &ex)
  {
    throw gutil::IOException(ex.what());
  }
}